

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O0

ze_result_t
driver::zeVirtualMemQueryPageSize
          (ze_context_handle_t hContext,ze_device_handle_t hDevice,size_t size,size_t *pagesize)

{
  ze_pfnVirtualMemQueryPageSize_t pfnQueryPageSize;
  ze_result_t result;
  size_t *pagesize_local;
  size_t size_local;
  ze_device_handle_t hDevice_local;
  ze_context_handle_t hContext_local;
  
  pfnQueryPageSize._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c730 != (code *)0x0) {
    pfnQueryPageSize._4_4_ = (*DAT_0011c730)(hContext,hDevice,size,pagesize);
  }
  return pfnQueryPageSize._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeVirtualMemQueryPageSize(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        ze_device_handle_t hDevice,                     ///< [in] handle of the device object
        size_t size,                                    ///< [in] unaligned allocation size in bytes
        size_t* pagesize                                ///< [out] pointer to page size to use for start address and size
                                                        ///< alignments.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnQueryPageSize = context.zeDdiTable.VirtualMem.pfnQueryPageSize;
        if( nullptr != pfnQueryPageSize )
        {
            result = pfnQueryPageSize( hContext, hDevice, size, pagesize );
        }
        else
        {
            // generic implementation
        }

        return result;
    }